

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O1

int read_face(p_ply_argument argument)

{
  undefined4 *puVar1;
  double dVar2;
  uint32_t **p_triangle;
  long value_index;
  long length;
  long *local_28;
  ulong local_20;
  long local_18;
  
  ply_get_argument_user_data(argument,&local_28,(long *)0x0);
  ply_get_argument_property(argument,(p_ply_property *)0x0,&local_18,(long *)&local_20);
  if (local_20 < 3) {
    dVar2 = ply_get_argument_value(argument);
    puVar1 = (undefined4 *)*local_28;
    *puVar1 = (int)(long)dVar2;
    *local_28 = (long)(puVar1 + 1);
  }
  return 1;
}

Assistant:

static int read_face(p_ply_argument argument)
  {
  uint32_t** p_triangle;
  ply_get_argument_user_data(argument, (void**)&p_triangle, NULL);
  long length, value_index;
  ply_get_argument_property(argument, NULL, &length, &value_index);
  if (value_index >= 0 && value_index < 3)
    {
    double val = ply_get_argument_value(argument);
    *(*p_triangle) = (uint32_t)val;
    ++(*p_triangle);
    }
  return 1;
  }